

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

int __thiscall NaDynAr<NaPetriNode_*>::addl(NaDynAr<NaPetriNode_*> *this,NaPetriNode **pobj)

{
  item *piVar1;
  undefined4 *puVar2;
  
  if (pobj != (NaPetriNode **)0x0) {
    piVar1 = (item *)operator_new(0x10);
    piVar1->pData = pobj;
    piVar1->pNext = (item *)0x0;
    if (this->pHead == (item *)0x0) {
      this->pTail = piVar1;
    }
    else {
      piVar1->pNext = this->pHead;
    }
    this->pHead = piVar1;
    this->nItems = this->nItems + 1;
    return 0;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

virtual int	addl (type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item	*p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::addl(this=0x%08p), %d items, new item=0x%08p\n",
	       this, nItems, p);
#endif /* DynAr_DEBUG */

    if(NULL == pHead){
      pHead = pTail = p;
    }
    else{
      p->pNext = pHead;
      pHead = p;
    }
    ++nItems;

    return 0;
  }